

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

void __thiscall hwnet::Epoll::Enable(Epoll *this,Ptr *channel,int flag)

{
  int __fd;
  int iVar1;
  uint local_2c;
  element_type *local_28;
  
  local_28 = (channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_2c = flag & 4U | (uint)flag >> 1 & 1 | local_28->events;
  iVar1 = this->epfd;
  __fd = (*local_28->_vptr_Channel[1])(local_28);
  iVar1 = epoll_ctl(iVar1,3,__fd,(epoll_event *)&local_2c);
  if (iVar1 == 0) {
    ((channel->super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->events =
         local_2c;
  }
  return;
}

Assistant:

void Epoll::Enable(const Channel::Ptr &channel,int flag) {

	epoll_event ev = {0};
	ev.data.ptr = channel.get();
	ev.events = channel->events;
		
	if(flag & Poller::Read) {
		ev.events |= EPOLLIN;
	}

	if(flag & Poller::Write) {
		ev.events |= EPOLLOUT;
	}

	if(0 == epoll_ctl(this->epfd,EPOLL_CTL_MOD,channel->Fd(),&ev)) {
		channel->events = ev.events;
	}

}